

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

ExprP<tcu::Vector<float,_3>_> __thiscall
deqp::gls::BuiltinPrecisionTests::
createApply<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,3>,bool,tcu::Vector<float,3>,tcu::Vector<float,3>,deqp::gls::BuiltinPrecisionTests::Void>>
          (BuiltinPrecisionTests *this,
          Func<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_3>,_bool,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *func,ExprP<bool> *arg0,ExprP<tcu::Vector<float,_3>_> *arg1,
          ExprP<tcu::Vector<float,_3>_> *arg2,ExprP<deqp::gls::BuiltinPrecisionTests::Void> *arg3)

{
  Apply<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_3>,_bool,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *this_00;
  ExprP<tcu::Vector<float,_3>_> EVar1;
  
  this_00 = (Apply<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_3>,_bool,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void>_>
             *)operator_new(0x50);
  Apply<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_3>,_bool,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  ::Apply(this_00,func,arg0,arg1,arg2,arg3);
  EVar1 = exprP<tcu::Vector<float,3>>(this,(Expr<tcu::Vector<float,_3>_> *)this_00);
  EVar1.super_ContainerExprPBase<tcu::Vector<float,_3>_>.super_ExprPBase<tcu::Vector<float,_3>_>.
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_3>_>_>.m_ptr =
       (Expr<tcu::Vector<float,_3>_> *)this;
  return (ExprP<tcu::Vector<float,_3>_>)
         EVar1.super_ContainerExprPBase<tcu::Vector<float,_3>_>.
         super_ExprPBase<tcu::Vector<float,_3>_>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_3>_>_>;
}

Assistant:

ExprP<typename Sig::Ret> createApply (
	const Func<Sig>&			func,
	const ExprP<typename Sig::Arg0>&	arg0 = voidP(),
	const ExprP<typename Sig::Arg1>&	arg1 = voidP(),
	const ExprP<typename Sig::Arg2>&	arg2 = voidP(),
	const ExprP<typename Sig::Arg3>&	arg3 = voidP())
{
	return exprP(new Apply<Sig>(func, arg0, arg1, arg2, arg3));
}